

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmFunctionInfo.cpp
# Opt level: O1

void __thiscall
Wasm::WasmFunctionInfo::WasmFunctionInfo
          (WasmFunctionInfo *this,ArenaAllocator *alloc,WasmSignature *signature,uint32 number)

{
  Type *addr;
  uint uVar1;
  ArgSlot AVar2;
  ArgSlot AVar3;
  Local LVar4;
  ArgSlot i;
  
  this->importedFunctionReference = (Type)0x0;
  this->m_alloc = alloc;
  AVar2 = WasmSignature::GetParamCount(signature);
  (this->m_locals).buffer = (Type)0x0;
  (this->m_locals).count = 0;
  (this->m_locals).length = (uint)AVar2;
  (this->m_locals).alloc = alloc;
  JsUtil::GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator>::EnsureArray
            (&this->m_locals);
  (this->m_body).ptr = (FunctionBody *)0x0;
  addr = &this->m_signature;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = signature;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  AVar2 = 0;
  this->m_nameLength = 0;
  (this->m_customReader).ptr = (WasmReaderBase *)0x0;
  (this->m_name).ptr = (char16_t *)0x0;
  this->m_number = number;
  (this->m_readerInfo).size = 0;
  (this->m_readerInfo).startOffset = 0;
  while( true ) {
    AVar3 = WasmSignature::GetParamCount(signature);
    if (AVar3 <= AVar2) break;
    LVar4 = WasmSignature::GetParam(signature,AVar2);
    JsUtil::GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator>::EnsureArray
              (&this->m_locals);
    uVar1 = (this->m_locals).count;
    (this->m_locals).buffer[uVar1] = LVar4;
    (this->m_locals).count = uVar1 + 1;
    AVar2 = AVar2 + 1;
  }
  return;
}

Assistant:

WasmFunctionInfo::WasmFunctionInfo(ArenaAllocator* alloc, WasmSignature* signature, uint32 number) : 
    m_alloc(alloc),
    m_signature(signature),
    m_body(nullptr),
    m_name(nullptr),
    m_customReader(nullptr),
    m_nameLength(0),
    m_number(number),
    m_locals(alloc, signature->GetParamCount())
#if DBG_DUMP
    , importedFunctionReference(nullptr)
#endif
{
    for (Js::ArgSlot i = 0; i < signature->GetParamCount(); ++i)
    {
        m_locals.Add(signature->GetParam(i));
    }
}